

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestMemCheckCommand.cxx
# Opt level: O0

void __thiscall cmCTestMemCheckCommand::cmCTestMemCheckCommand(cmCTestMemCheckCommand *this)

{
  reference ppcVar1;
  cmCTestMemCheckCommand *this_local;
  
  cmCTestTestCommand::cmCTestTestCommand(&this->super_cmCTestTestCommand);
  (this->super_cmCTestTestCommand).super_cmCTestHandlerCommand.super_cmCTestCommand.super_cmCommand.
  _vptr_cmCommand = (_func_int **)&PTR__cmCTestMemCheckCommand_00d9d718;
  ppcVar1 = std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[]
                      (&(this->super_cmCTestTestCommand).super_cmCTestHandlerCommand.Arguments,0x16)
  ;
  *ppcVar1 = "DEFECT_COUNT";
  ppcVar1 = std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[]
                      (&(this->super_cmCTestTestCommand).super_cmCTestHandlerCommand.Arguments,0x17)
  ;
  *ppcVar1 = (value_type)0x0;
  (this->super_cmCTestTestCommand).super_cmCTestHandlerCommand.Last = 0x17;
  return;
}

Assistant:

cmCTestMemCheckCommand::cmCTestMemCheckCommand()
{
  this->Arguments[ctm_DEFECT_COUNT] = "DEFECT_COUNT";
  this->Arguments[ctm_LAST] = CM_NULLPTR;
  this->Last = ctm_LAST;
}